

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O0

DdNode * extraBddSpaceFromFunctionPos(DdManager *dd,DdNode *bF)

{
  DdNode *pDVar1;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *E;
  DdNode *T;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bNeg1;
  DdNode *bNeg0;
  DdNode *bPos1;
  DdNode *bPos0;
  DdNode *bF1;
  DdNode *bF0;
  DdNode *bFR;
  DdNode *bRes;
  DdNode *bF_local;
  DdManager *dd_local;
  
  pDVar1 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar1->index == 0x7fffffff) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup1(dd,extraBddSpaceFromFunctionPos,bF);
    if (dd_local == (DdManager *)0x0) {
      if (pDVar1 == bF) {
        bF1 = (pDVar1->type).kids.E;
        bPos0 = (pDVar1->type).kids.T;
      }
      else {
        bF1 = (DdNode *)((ulong)(pDVar1->type).kids.E ^ 1);
        bPos0 = (DdNode *)((ulong)(pDVar1->type).kids.T ^ 1);
      }
      pDVar2 = extraBddSpaceFromFunctionPos(dd,bF1);
      if (pDVar2 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
        pDVar3 = extraBddSpaceFromFunctionPos(dd,bPos0);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,pDVar2);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
          E = cuddBddAndRecur(dd,pDVar2,pDVar3);
          if (E == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,pDVar3);
            dd_local = (DdManager *)0x0;
          }
          else {
            *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                 *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
            Cudd_RecursiveDeref(dd,pDVar2);
            Cudd_RecursiveDeref(dd,pDVar3);
            pDVar2 = extraBddSpaceFromFunctionNeg(dd,bF1);
            if (pDVar2 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,E);
              dd_local = (DdManager *)0x0;
            }
            else {
              *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
                   *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
              pDVar3 = extraBddSpaceFromFunctionNeg(dd,bPos0);
              if (pDVar3 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,E);
                Cudd_RecursiveDeref(dd,pDVar2);
                dd_local = (DdManager *)0x0;
              }
              else {
                *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
                     *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
                T = cuddBddAndRecur(dd,pDVar2,pDVar3);
                if (T == (DdNode *)0x0) {
                  Cudd_RecursiveDeref(dd,E);
                  Cudd_RecursiveDeref(dd,pDVar2);
                  Cudd_RecursiveDeref(dd,pDVar3);
                  dd_local = (DdManager *)0x0;
                }
                else {
                  *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + 1;
                  Cudd_RecursiveDeref(dd,pDVar2);
                  Cudd_RecursiveDeref(dd,pDVar3);
                  bFR = T;
                  if (E != T) {
                    if (((ulong)T & 1) == 0) {
                      bFR = cuddUniqueInter(dd,pDVar1->index,T,E);
                      if (bFR == (DdNode *)0x0) {
                        Cudd_RecursiveDeref(dd,E);
                        Cudd_RecursiveDeref(dd,T);
                        return (DdNode *)0x0;
                      }
                    }
                    else {
                      pDVar1 = cuddUniqueInter(dd,pDVar1->index,(DdNode *)((ulong)T ^ 1),
                                               (DdNode *)((ulong)E ^ 1));
                      if (pDVar1 == (DdNode *)0x0) {
                        Cudd_RecursiveDeref(dd,E);
                        Cudd_RecursiveDeref(dd,T);
                        return (DdNode *)0x0;
                      }
                      bFR = (DdNode *)((ulong)pDVar1 ^ 1);
                    }
                  }
                  *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
                  *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) =
                       *(int *)(((ulong)T & 0xfffffffffffffffe) + 4) + -1;
                  cuddCacheInsert1(dd,extraBddSpaceFromFunctionPos,bF,bFR);
                  dd_local = (DdManager *)bFR;
                }
              }
            }
          }
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddSpaceFromFunctionPos( DdManager * dd, DdNode * bF )
{
    DdNode * bRes, * bFR;
    statLine( dd );

    bFR = Cudd_Regular(bF);
    if ( cuddIsConstant(bFR) )
        return b1;

    if ( (bRes = cuddCacheLookup1(dd, extraBddSpaceFromFunctionPos, bF)) )
        return bRes;
    else
    {
        DdNode * bF0,   * bF1;
        DdNode * bPos0, * bPos1;
        DdNode * bNeg0, * bNeg1;
        DdNode * bRes0, * bRes1; 

        if ( bFR != bF ) // bF is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }


        bPos0  = extraBddSpaceFromFunctionPos( dd, bF0 );
        if ( bPos0 == NULL )
            return NULL;
        cuddRef( bPos0 );

        bPos1  = extraBddSpaceFromFunctionPos( dd, bF1 );
        if ( bPos1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            return NULL;
        }
        cuddRef( bPos1 );

        bRes0  = cuddBddAndRecur( dd, bPos0, bPos1 );
        if ( bRes0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bPos0 );
            Cudd_RecursiveDeref( dd, bPos1 );
            return NULL;
        }
        cuddRef( bRes0 );
        Cudd_RecursiveDeref( dd, bPos0 );
        Cudd_RecursiveDeref( dd, bPos1 );


        bNeg0  = extraBddSpaceFromFunctionNeg( dd, bF0 );
        if ( bNeg0 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bNeg0 );

        bNeg1  = extraBddSpaceFromFunctionNeg( dd, bF1 );
        if ( bNeg1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            return NULL;
        }
        cuddRef( bNeg1 );

        bRes1  = cuddBddAndRecur( dd, bNeg0, bNeg1 );
        if ( bRes1 == NULL )
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            Cudd_RecursiveDeref( dd, bNeg0 );
            Cudd_RecursiveDeref( dd, bNeg1 );
            return NULL;
        }
        cuddRef( bRes1 );
        Cudd_RecursiveDeref( dd, bNeg0 );
        Cudd_RecursiveDeref( dd, bNeg1 );


        // consider the case when Res0 and Res1 are the same node 
        if ( bRes0 == bRes1 )
            bRes = bRes1;
        // consider the case when Res1 is complemented 
        else if ( Cudd_IsComplement(bRes1) ) 
        {
            bRes = cuddUniqueInter( dd, bFR->index, Cudd_Not(bRes1), Cudd_Not(bRes0) );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
            bRes = Cudd_Not(bRes);
        } 
        else 
        {
            bRes = cuddUniqueInter( dd, bFR->index, bRes1, bRes0 );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref(dd,bRes0);
                Cudd_RecursiveDeref(dd,bRes1);
                return NULL;
            }
        }
        cuddDeref( bRes0 );
        cuddDeref( bRes1 );

        cuddCacheInsert1( dd, extraBddSpaceFromFunctionPos, bF, bRes );
        return bRes;
    }
}